

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_5d835d::Db::parsePositiveInteger(Db *this,size_t *Out)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  
  *Out = 0;
  pcVar1 = this->First;
  pcVar2 = this->Last;
  bVar3 = true;
  if ((pcVar2 != pcVar1) && (0xf5 < (byte)(*pcVar1 - 0x3aU))) {
    if ((byte)(*pcVar1 - 0x30U) < 10) {
      sVar4 = 0;
      do {
        pcVar5 = pcVar1 + 1;
        *Out = sVar4 * 10;
        this->First = pcVar5;
        sVar4 = (sVar4 * 10 + (long)*pcVar1) - 0x30;
        *Out = sVar4;
        if (pcVar5 == pcVar2) break;
        pcVar1 = pcVar5;
      } while ((byte)(*pcVar5 - 0x30U) < 10);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Db::parsePositiveInteger(size_t *Out) {
  *Out = 0;
  if (look() < '0' || look() > '9')
    return true;
  while (look() >= '0' && look() <= '9') {
    *Out *= 10;
    *Out += static_cast<size_t>(consume() - '0');
  }
  return false;
}